

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O0

bool __thiscall
lzham::vector<unsigned_char>::insert(vector<unsigned_char> *this,uint index,uchar *p,uint n)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  uint in_ECX;
  void *in_RDX;
  uint in_ESI;
  long *in_RDI;
  uchar *pDst;
  uint num_to_move;
  uint orig_size;
  vector<unsigned_char> *in_stack_ffffffffffffffc8;
  bool local_1;
  
  if (in_ECX == 0) {
    local_1 = true;
  }
  else {
    lVar1 = in_RDI[1];
    bVar2 = try_resize(in_stack_ffffffffffffffc8,(uint)((ulong)in_RDI >> 0x20),
                       SUB81((ulong)in_RDI >> 0x18,0));
    if (bVar2) {
      uVar3 = (int)lVar1 - in_ESI;
      if (uVar3 != 0) {
        memmove((void *)(*in_RDI + (ulong)in_ESI + (ulong)in_ECX),(void *)(*in_RDI + (ulong)in_ESI),
                (ulong)uVar3);
      }
      memcpy((void *)(*in_RDI + (ulong)in_ESI),in_RDX,(ulong)in_ECX);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

inline bool insert(uint index, const T* p, uint n)
      {
         LZHAM_ASSERT(index <= m_size);
         if (!n)
            return true;
                  
         const uint orig_size = m_size;
         if (!try_resize(m_size + n, true))
            return false;

         const uint num_to_move = orig_size - index;
         if (num_to_move)
         {
            if (LZHAM_IS_BITWISE_COPYABLE(T))
               memmove(m_p + index + n, m_p + index, sizeof(T) * num_to_move);
            else
            {
               const T* pSrc = m_p + orig_size - 1;
               T* pDst = const_cast<T*>(pSrc) + n;

               for (uint i = 0; i < num_to_move; i++)
               {
                  LZHAM_ASSERT((pDst - m_p) < (int)m_size);
                  *pDst-- = *pSrc--;
               }
            }
         }

         T* pDst = m_p + index;

         if (LZHAM_IS_BITWISE_COPYABLE(T))
            memcpy(pDst, p, sizeof(T) * n);
         else
         {
            for (uint i = 0; i < n; i++)
            {
               LZHAM_ASSERT((pDst - m_p) < (int)m_size);
               *pDst++ = *p++;
            }
         }

         return true;
      }